

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.hpp
# Opt level: O1

void __thiscall ot::commissioner::BorderAgent::~BorderAgent(BorderAgent *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  this->_vptr_BorderAgent = (_func_int **)&PTR__BorderAgent_002b6248;
  pcVar1 = (this->mServiceName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mServiceName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mDomainName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mDomainName).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->mVendorOui).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pcVar1 = (this->mVendorData)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mVendorData).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mModelName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mModelName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mVendorName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mVendorName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mNetworkName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mNetworkName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mThreadVersion)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mThreadVersion).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->mDiscriminator).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pcVar1 = (this->mAddr)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mAddr).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~BorderAgent() = default;